

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

int lys_ext_dup(ly_ctx *ctx,lys_module *mod,lys_ext_instance **orig,uint8_t size,void *parent,
               LYEXT_PAR parent_type,lys_ext_instance ***new,int shallow,unres_schema *unres)

{
  lyext_check_position_clb __size;
  undefined8 *puVar1;
  int iVar2;
  lys_ext_instance **e;
  lys_ext_instance *plVar3;
  char *pcVar4;
  lys_node *snode;
  lyxml_elem *plVar5;
  size_t len;
  unres_ext *info_orig;
  unres_ext *info;
  lys_ext_instance **result;
  uint8_t u;
  int i;
  LYEXT_PAR parent_type_local;
  void *parent_local;
  lys_ext_instance **pplStack_28;
  uint8_t size_local;
  lys_ext_instance **orig_local;
  lys_module *mod_local;
  ly_ctx *ctx_local;
  
  pplStack_28 = orig;
  orig_local = (lys_ext_instance **)mod;
  mod_local = (lys_module *)ctx;
  if (new == (lys_ext_instance ***)0x0) {
    __assert_fail("new",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                  ,0x5e7,
                  "int lys_ext_dup(struct ly_ctx *, struct lys_module *, struct lys_ext_instance **, uint8_t, void *, LYEXT_PAR, struct lys_ext_instance ***, int, struct unres_schema *)"
                 );
  }
  if (size == '\0') {
    if (orig == (lys_ext_instance **)0x0) {
      *new = (lys_ext_instance **)0x0;
      ctx_local._4_4_ = 0;
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
             ,0x5eb);
      ctx_local._4_4_ = 1;
    }
  }
  else {
    e = (lys_ext_instance **)calloc((ulong)size,8);
    *new = e;
    if (e == (lys_ext_instance **)0x0) {
      ly_log((ly_ctx *)mod_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_ext_dup");
      ctx_local._4_4_ = 1;
    }
    else {
      for (result._7_1_ = 0; result._7_1_ < size; result._7_1_ = result._7_1_ + 1) {
        if (pplStack_28[result._7_1_] == (lys_ext_instance *)0x0) {
          iVar2 = unres_schema_find(unres,-1,&stack0xffffffffffffffd8,UNRES_EXT);
          if (iVar2 == -1) {
            ly_log((ly_ctx *)mod_local,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
                   ,0x624);
LAB_0018cc3c:
            *new = (lys_ext_instance **)0x0;
            lys_extension_instances_free
                      ((ly_ctx *)mod_local,e,(uint)result._7_1_,
                       (_func_void_lys_node_ptr_void_ptr *)0x0);
            return 1;
          }
          puVar1 = (undefined8 *)unres->str_snode[iVar2];
          snode = (lys_node *)malloc(0x30);
          if (snode == (lys_node *)0x0) {
            ly_log((ly_ctx *)mod_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                   "lys_ext_dup");
            goto LAB_0018cc3c;
          }
          *(undefined4 *)&snode->dsc = *(undefined4 *)(puVar1 + 1);
          if (*(int *)&snode->dsc == 2) {
            plVar5 = lyxml_dup_elem((ly_ctx *)mod_local,(lyxml_elem *)*puVar1,(lyxml_elem *)0x0,1,0)
            ;
            snode->name = &plVar5->flags;
          }
          snode->ref = (char *)parent;
          *(lys_ext_instance ***)&snode->flags = orig_local;
          *(LYEXT_PAR *)&snode->ext = parent_type;
          *(byte *)((long)&snode->iffeature + 1) = result._7_1_;
          iVar2 = unres_schema_add_node(*(lys_module **)&snode->flags,unres,new,UNRES_EXT,snode);
          if (iVar2 == -1) goto LAB_0018cc3c;
        }
        else {
          if (pplStack_28[result._7_1_]->ext_type == '\0') {
            plVar3 = (lys_ext_instance *)malloc(0x40);
            e[result._7_1_] = plVar3;
            if (e[result._7_1_] == (lys_ext_instance *)0x0) {
              ly_log((ly_ctx *)mod_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_ext_dup");
              goto LAB_0018cc3c;
            }
          }
          else if (pplStack_28[result._7_1_]->ext_type == '\x01') {
            __size = pplStack_28[result._7_1_]->def->plugin[1].check_position;
            plVar3 = (lys_ext_instance *)calloc(1,(size_t)__size);
            e[result._7_1_] = plVar3;
            if (e[result._7_1_] == (lys_ext_instance *)0x0) {
              ly_log((ly_ctx *)mod_local,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).",
                     "lys_ext_dup");
              goto LAB_0018cc3c;
            }
            e[result._7_1_][1].def = *(lys_ext **)(pplStack_28[result._7_1_]->def->plugin + 1);
            memcpy(e[result._7_1_] + 1,pplStack_28[result._7_1_] + 1,(size_t)(__size + -0x40));
          }
          e[result._7_1_]->def = pplStack_28[result._7_1_]->def;
          e[result._7_1_]->flags = 4;
          pcVar4 = lydict_insert((ly_ctx *)mod_local,pplStack_28[result._7_1_]->arg_value,0);
          e[result._7_1_]->arg_value = pcVar4;
          e[result._7_1_]->parent = parent;
          e[result._7_1_]->parent_type = (uint8_t)parent_type;
          e[result._7_1_]->insubstmt = pplStack_28[result._7_1_]->insubstmt;
          e[result._7_1_]->insubstmt_index = pplStack_28[result._7_1_]->insubstmt_index;
          e[result._7_1_]->ext_type = pplStack_28[result._7_1_]->ext_type;
          e[result._7_1_]->priv = (void *)0x0;
          e[result._7_1_]->nodetype = LYS_EXT;
          e[result._7_1_]->module = (lys_module *)orig_local;
          e[result._7_1_]->ext_size = pplStack_28[result._7_1_]->ext_size;
          iVar2 = lys_ext_dup((ly_ctx *)mod_local,(lys_module *)orig_local,
                              pplStack_28[result._7_1_]->ext,pplStack_28[result._7_1_]->ext_size,
                              e[result._7_1_],LYEXT_PAR_EXTINST,&e[result._7_1_]->ext,shallow,unres)
          ;
          if (iVar2 != 0) goto LAB_0018cc3c;
          if (shallow != 0) {
            e[result._7_1_]->priv = pplStack_28[result._7_1_]->priv;
          }
        }
      }
      ctx_local._4_4_ = 0;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int
lys_ext_dup(struct ly_ctx *ctx, struct lys_module *mod, struct lys_ext_instance **orig, uint8_t size, void *parent,
            LYEXT_PAR parent_type, struct lys_ext_instance ***new, int shallow, struct unres_schema *unres)
{
    int i;
    uint8_t u = 0;
    struct lys_ext_instance **result;
    struct unres_ext *info, *info_orig;
    size_t len;

    assert(new);

    if (!size) {
        if (orig) {
            LOGINT(ctx);
            return EXIT_FAILURE;
        }
        (*new) = NULL;
        return EXIT_SUCCESS;
    }

    (*new) = result = calloc(size, sizeof *result);
    LY_CHECK_ERR_RETURN(!result, LOGMEM(ctx), EXIT_FAILURE);
    for (u = 0; u < size; u++) {
        if (orig[u]) {
            /* resolved extension instance, just duplicate it */
            switch(orig[u]->ext_type) {
            case LYEXT_FLAG:
                result[u] = malloc(sizeof(struct lys_ext_instance));
                LY_CHECK_ERR_GOTO(!result[u], LOGMEM(ctx), error);
                break;
            case LYEXT_COMPLEX:
                len = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->instance_size;
                result[u] = calloc(1, len);
                LY_CHECK_ERR_GOTO(!result[u], LOGMEM(ctx), error);

                ((struct lys_ext_instance_complex*)result[u])->substmt = ((struct lyext_plugin_complex*)orig[u]->def->plugin)->substmt;
                /* TODO duplicate data in extension instance content */
                memcpy((void*)result[u] + sizeof(**orig), (void*)orig[u] + sizeof(**orig), len - sizeof(**orig));
                break;
            }
            /* generic part */
            result[u]->def = orig[u]->def;
            result[u]->flags = LYEXT_OPT_CONTENT;
            result[u]->arg_value = lydict_insert(ctx, orig[u]->arg_value, 0);
            result[u]->parent = parent;
            result[u]->parent_type = parent_type;
            result[u]->insubstmt = orig[u]->insubstmt;
            result[u]->insubstmt_index = orig[u]->insubstmt_index;
            result[u]->ext_type = orig[u]->ext_type;
            result[u]->priv = NULL;
            result[u]->nodetype = LYS_EXT;
            result[u]->module = mod;

            /* extensions */
            result[u]->ext_size = orig[u]->ext_size;
            if (lys_ext_dup(ctx, mod, orig[u]->ext, orig[u]->ext_size, result[u],
                            LYEXT_PAR_EXTINST, &result[u]->ext, shallow, unres)) {
                goto error;
            }

            /* in case of shallow copy (duplication for deviation), duplicate only the link to private data
             * in a new copy, otherwise (grouping instantiation) do not duplicate the private data */
            if (shallow) {
                result[u]->priv = orig[u]->priv;
            }
        } else {
            /* original extension is not yet resolved, so duplicate it in unres */
            i = unres_schema_find(unres, -1, &orig, UNRES_EXT);
            if (i == -1) {
                /* extension not found in unres */
                LOGINT(ctx);
                goto error;
            }
            info_orig = unres->str_snode[i];
            info = malloc(sizeof *info);
            LY_CHECK_ERR_GOTO(!info, LOGMEM(ctx), error);
            info->datatype = info_orig->datatype;
            if (info->datatype == LYS_IN_YIN) {
                info->data.yin = lyxml_dup_elem(ctx, info_orig->data.yin, NULL, 1, 0);
            } /* else TODO YANG */
            info->parent = parent;
            info->mod = mod;
            info->parent_type = parent_type;
            info->ext_index = u;
            if (unres_schema_add_node(info->mod, unres, new, UNRES_EXT, (struct lys_node *)info) == -1) {
                goto error;
            }
        }
    }

    return EXIT_SUCCESS;

error:
    (*new) = NULL;
    lys_extension_instances_free(ctx, result, u, NULL);
    return EXIT_FAILURE;
}